

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_level.c
# Opt level: O0

void prf_push_level_entry_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_push_level_info.opcode) {
    *(short *)(in_RSI + 0x76) = *(short *)(in_RSI + 0x76) + 1;
  }
  else {
    prf_error(9,"tried push level entry state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_push_level_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_push_level_info.opcode ) {
        prf_error( 9, "tried push level entry state method on node of type %d.",
            node->opcode );
        return;
    }
    state->push_level++;
}